

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
::fulfill(AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
          *this,Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value)

{
  ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> local_1e0;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    ExceptionOr(&local_1e0,value);
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    operator=(&this->result,&local_1e0);
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    ~ExceptionOr(&local_1e0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }